

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

ValueType *
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::GetValidateErrorKeyword(ValidateErrorCode validateErrorCode)

{
  int iVar1;
  ValueType *pVVar2;
  
  switch(validateErrorCode) {
  case kValidateErrorMultipleOf:
    pVVar2 = GetMultipleOfString();
    return pVVar2;
  case kValidateErrorMaximum:
  case kValidateErrorExclusiveMaximum:
    pVVar2 = GetMaximumString();
    return pVVar2;
  case kValidateErrorMinimum:
  case kValidateErrorExclusiveMinimum:
    pVVar2 = GetMinimumString();
    return pVVar2;
  case kValidateErrorMaxLength:
    pVVar2 = GetMaxLengthString();
    return pVVar2;
  case kValidateErrorMinLength:
    pVVar2 = GetMinLengthString();
    return pVVar2;
  case kValidateErrorPattern:
    pVVar2 = GetPatternString();
    return pVVar2;
  case kValidateErrorMaxItems:
    pVVar2 = GetMaxItemsString();
    return pVVar2;
  case kValidateErrorMinItems:
    pVVar2 = GetMinItemsString();
    return pVVar2;
  case kValidateErrorUniqueItems:
    pVVar2 = GetUniqueItemsString();
    return pVVar2;
  case kValidateErrorAdditionalItems:
    pVVar2 = GetAdditionalItemsString();
    return pVVar2;
  case kValidateErrorMaxProperties:
    pVVar2 = GetMaxPropertiesString();
    return pVVar2;
  case kValidateErrorMinProperties:
    pVVar2 = GetMinPropertiesString();
    return pVVar2;
  case kValidateErrorRequired:
    pVVar2 = GetRequiredString();
    return pVVar2;
  case kValidateErrorAdditionalProperties:
    pVVar2 = GetAdditionalPropertiesString();
    return pVVar2;
  case kValidateErrorPatternProperties:
    pVVar2 = GetPatternPropertiesString();
    return pVVar2;
  case kValidateErrorDependencies:
    pVVar2 = GetDependenciesString();
    return pVVar2;
  case kValidateErrorEnum:
    pVVar2 = GetEnumString();
    return pVVar2;
  case kValidateErrorType:
    pVVar2 = GetTypeString();
    return pVVar2;
  case kValidateErrorOneOf:
  case kValidateErrorOneOfMatch:
    pVVar2 = GetOneOfString();
    return pVVar2;
  case kValidateErrorAllOf:
    pVVar2 = GetAllOfString();
    return pVVar2;
  case kValidateErrorAnyOf:
    pVVar2 = GetAnyOfString();
    return pVVar2;
  case kValidateErrorNot:
    pVVar2 = GetNotString();
    return pVVar2;
  case kValidateErrorReadOnly:
    pVVar2 = GetReadOnlyString();
    return pVVar2;
  case kValidateErrorWriteOnly:
    pVVar2 = GetWriteOnlyString();
    return pVVar2;
  }
  if ((Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>
       ::GetNullString()::v == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>
                                   ::GetNullString()::v), iVar1 != 0)) {
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(&GetNullString::v,"null",4);
    __cxa_guard_release(&Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>
                         ::GetNullString()::v);
  }
  return &GetNullString::v;
}

Assistant:

static const ValueType& GetValidateErrorKeyword(ValidateErrorCode validateErrorCode) {
        switch (validateErrorCode) {
            case kValidateErrorMultipleOf:              return GetMultipleOfString();
            case kValidateErrorMaximum:                 return GetMaximumString();
            case kValidateErrorExclusiveMaximum:        return GetMaximumString(); // Same
            case kValidateErrorMinimum:                 return GetMinimumString();
            case kValidateErrorExclusiveMinimum:        return GetMinimumString(); // Same

            case kValidateErrorMaxLength:               return GetMaxLengthString();
            case kValidateErrorMinLength:               return GetMinLengthString();
            case kValidateErrorPattern:                 return GetPatternString();

            case kValidateErrorMaxItems:                return GetMaxItemsString();
            case kValidateErrorMinItems:                return GetMinItemsString();
            case kValidateErrorUniqueItems:             return GetUniqueItemsString();
            case kValidateErrorAdditionalItems:         return GetAdditionalItemsString();

            case kValidateErrorMaxProperties:           return GetMaxPropertiesString();
            case kValidateErrorMinProperties:           return GetMinPropertiesString();
            case kValidateErrorRequired:                return GetRequiredString();
            case kValidateErrorAdditionalProperties:    return GetAdditionalPropertiesString();
            case kValidateErrorPatternProperties:       return GetPatternPropertiesString();
            case kValidateErrorDependencies:            return GetDependenciesString();

            case kValidateErrorEnum:                    return GetEnumString();
            case kValidateErrorType:                    return GetTypeString();

            case kValidateErrorOneOf:                   return GetOneOfString();
            case kValidateErrorOneOfMatch:              return GetOneOfString(); // Same
            case kValidateErrorAllOf:                   return GetAllOfString();
            case kValidateErrorAnyOf:                   return GetAnyOfString();
            case kValidateErrorNot:                     return GetNotString();

            case kValidateErrorReadOnly:                return GetReadOnlyString();
            case kValidateErrorWriteOnly:               return GetWriteOnlyString();

            default:                                    return GetNullString();
        }
    }